

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O3

void Gia_PolyCollectRoots_rec
               (Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Bit_t *vMarks,int iBox,Vec_Int_t *vRoots)

{
  int iVar1;
  int iBox_00;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  lVar5 = 0;
  while ((-1 < iBox && (lVar4 = (ulong)(uint)(iBox * 6) + lVar5, (int)lVar4 < vAdds->nSize))) {
    iVar1 = vAdds->pArray[lVar4];
    lVar4 = (long)iVar1;
    if ((lVar4 < 0) || (vMap->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    if (iVar1 != 0) {
      pVVar2 = vMap->pArray;
      iVar3 = pVVar2[lVar4].nSize;
      if (1 < iVar3) {
        lVar7 = 1;
        do {
          iBox_00 = pVVar2[lVar4].pArray[lVar7 + -1];
          if ((iBox_00 < 0) || (uVar6 = iBox_00 * 6 + 4, vAdds->nSize <= (int)uVar6))
          goto LAB_0066d7bb;
          if (vAdds->pArray[uVar6] == iVar1) {
            uVar6 = pVVar2[lVar4].pArray[lVar7];
            if (((int)uVar6 < 0) || (vMarks->nSize <= (int)uVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if (((uint)vMarks->pArray[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) == 0) {
              Vec_IntPush(vRoots,uVar6);
              Gia_PolyCollectRoots_rec(vAdds,vMap,vMarks,iBox_00,vRoots);
              iVar3 = pVVar2[lVar4].nSize;
            }
          }
          lVar7 = lVar7 + 2;
        } while ((int)lVar7 < iVar3);
      }
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 3) {
      return;
    }
  }
LAB_0066d7bb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_PolyCollectRoots_rec( Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Bit_t * vMarks, int iBox, Vec_Int_t * vRoots )
{
    int k;
    for ( k = 0; k < 3; k++ )
    {
        int i, Index, Sum, Carry = Vec_IntEntry( vAdds, 6*iBox+k );
        Vec_Int_t * vLevel = Vec_WecEntry( vMap, Carry );
        if ( Carry == 0 )
            continue;
        Vec_IntForEachEntryDouble( vLevel, Index, Sum, i )
            if ( Vec_IntEntry(vAdds, 6*Index+4) == Carry && !Vec_BitEntry(vMarks, Sum) )
            {
                Vec_IntPush( vRoots, Sum );
                Gia_PolyCollectRoots_rec( vAdds, vMap, vMarks, Index, vRoots );
            }
    }
}